

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord2.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EllipsoidRecord2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EllipsoidRecord2 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EllipsoidRecord1::GetAsString_abi_cxx11_(&local_1c0,&this->super_EllipsoidRecord1);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\td(Sigma)/dt:      ");
  Vector::GetAsString_abi_cxx11_(&local_1e0,&this->m_DDT);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tVelocity:         ");
  Vector::GetAsString_abi_cxx11_(&local_200,&this->m_Velocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\tAngular Velocity: ");
  Vector::GetAsString_abi_cxx11_(&local_220,&this->m_AngularVelocity);
  std::operator<<(poVar1,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EllipsoidRecord2::GetAsString() const
{
    KStringStream ss;

    ss << EllipsoidRecord1::GetAsString()
       << "\td(Sigma)/dt:      " << m_DDT.GetAsString()
       << "\tVelocity:         " << m_Velocity.GetAsString()
       << "\tAngular Velocity: " << m_AngularVelocity.GetAsString();

    return ss.str();
}